

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IStreamingReporter *pIVar1;
  bool _aborting;
  TestRunStats local_80;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_001c29f0;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_001c2a58;
  pIVar1 = (this->m_reporter).m_p;
  _aborting = aborting(this);
  TestRunStats::TestRunStats(&local_80,&this->m_runInfo,&this->m_totals,_aborting);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar1,&local_80);
  TestRunStats::~TestRunStats(&local_80);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,this->m_prevRunner);
  local_80._vptr_TestRunStats = (_func_int **)0x0;
  (*(this->m_context->super_IContext)._vptr_IContext[9])();
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)&local_80);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this->m_prevResultCapture);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,&this->m_prevConfig);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::~vector(&this->m_unfinishedSections);
  AssertionInfo::~AssertionInfo(&this->m_lastAssertionInfo);
  Ptr<const_Catch::IConfig>::~Ptr(&this->m_prevConfig);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  Ptr<Catch::IStreamingReporter>::~Ptr(&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr(&this->m_config);
  AssertionResult::~AssertionResult(&this->m_lastResult);
  Option<Catch::SectionTracking::TestCaseTracker>::reset(&this->m_testCaseTracker);
  std::__cxx11::string::~string((string *)&this->m_runInfo);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
            m_context.setRunner( m_prevRunner );
            m_context.setConfig( NULL );
            m_context.setResultCapture( m_prevResultCapture );
            m_context.setConfig( m_prevConfig );
        }